

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

string * __thiscall
zsummer::log4z::CLogerManager::GetExampleConfig_abi_cxx11_
          (string *__return_storage_ptr__,CLogerManager *this)

{
  allocator<char> local_19;
  CLogerManager *local_18;
  CLogerManager *this_local;
  
  local_18 = this;
  this_local = (CLogerManager *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "[FileConfig]\n#path=./log/\n#level=DEBUG\n#display=true\n#monthdir=false\n#limit=100\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string GetExampleConfig()
	{
		return ""
			"[FileConfig]\n"
			"#path=./log/\n"
			"#level=DEBUG\n"
			"#display=true\n"
			"#monthdir=false\n"
			"#limit=100\n";
	}